

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseRunner.hpp
# Opt level: O0

void __thiscall Centaurus::BaseRunner::close_semaphore(BaseRunner *this,bool is_finalizing)

{
  bool is_finalizing_local;
  BaseRunner *this_local;
  
  if (this->m_slave_lock != (sem_t *)0x0) {
    sem_close((sem_t *)this->m_slave_lock);
  }
  if (is_finalizing) {
    sem_unlink(this->m_slave_lock_name);
  }
  return;
}

Assistant:

void close_semaphore(bool is_finalizing) {
#if defined(CENTAURUS_BUILD_WINDOWS)
    if (m_slave_lock != NULL) CloseHandle(m_slave_lock);
#elif defined(CENTAURUS_BUILD_LINUX)
    if (m_slave_lock != SEM_FAILED) sem_close(m_slave_lock);
    if (is_finalizing) sem_unlink(m_slave_lock_name);
#endif
  }